

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int context_eq(secp256k1_context *a,secp256k1_context *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  if ((a->declassify == b->declassify) && ((a->ecmult_gen_ctx).built == (b->ecmult_gen_ctx).built))
  {
    secp256k1_scalar_verify(&(a->ecmult_gen_ctx).scalar_offset);
    secp256k1_scalar_verify(&(b->ecmult_gen_ctx).scalar_offset);
    if (((a->ecmult_gen_ctx).scalar_offset.d[0] == (b->ecmult_gen_ctx).scalar_offset.d[0]) &&
       (((uVar2 = uVar3,
         (a->ecmult_gen_ctx).scalar_offset.d[1] == (b->ecmult_gen_ctx).scalar_offset.d[1] &&
         ((a->ecmult_gen_ctx).scalar_offset.d[2] == (b->ecmult_gen_ctx).scalar_offset.d[2])) &&
        ((a->ecmult_gen_ctx).scalar_offset.d[3] == (b->ecmult_gen_ctx).scalar_offset.d[3])))) {
      iVar1 = secp256k1_ge_eq_var(&(a->ecmult_gen_ctx).ge_offset,&(b->ecmult_gen_ctx).ge_offset);
      if (iVar1 != 0) {
        iVar1 = secp256k1_fe_equal(&(a->ecmult_gen_ctx).proj_blind,&(b->ecmult_gen_ctx).proj_blind);
        if (((iVar1 != 0) && ((a->illegal_callback).fn == (b->illegal_callback).fn)) &&
           (((a->illegal_callback).data == (b->illegal_callback).data &&
            ((a->error_callback).fn == (b->error_callback).fn)))) {
          uVar2 = (uint)((a->error_callback).data == (b->error_callback).data);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int context_eq(const secp256k1_context *a, const secp256k1_context *b) {
    return a->declassify == b->declassify
            && ecmult_gen_context_eq(&a->ecmult_gen_ctx, &b->ecmult_gen_ctx)
            && a->illegal_callback.fn == b->illegal_callback.fn
            && a->illegal_callback.data == b->illegal_callback.data
            && a->error_callback.fn == b->error_callback.fn
            && a->error_callback.data == b->error_callback.data;
}